

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_clone.c
# Opt level: O0

mpt_node * mpt_list_clone(mpt_node *src)

{
  mpt_node *pmVar1;
  mpt_node *pmVar2;
  mpt_node *pmVar3;
  mpt_node *cpy;
  mpt_node *last;
  mpt_node *first;
  mpt_node *src_local;
  
  last = (mpt_node *)0x0;
  cpy = (mpt_node *)0x0;
  first = src;
  while( true ) {
    if (first == (mpt_node *)0x0) {
      return last;
    }
    pmVar2 = mpt_node_clone(first);
    if (pmVar2 == (mpt_node *)0x0) break;
    pmVar3 = pmVar2;
    pmVar1 = pmVar2;
    if (cpy != (mpt_node *)0x0) {
      pmVar3 = mpt_gnode_after(cpy,pmVar2);
      pmVar1 = last;
    }
    last = pmVar1;
    cpy = pmVar3;
    if (first->children != (mpt_node *)0x0) {
      pmVar3 = mpt_list_clone(first->children);
      pmVar2->children = pmVar3;
      if (pmVar3 != (mpt_node *)0x0) break;
    }
    first = first->next;
  }
  while (last != (mpt_node *)0x0) {
    pmVar2 = last->next;
    mpt_node_unlink(last);
    mpt_node_destroy(last);
    last = pmVar2;
  }
  return (mpt_node *)0x0;
}

Assistant:

extern MPT_STRUCT(node) *mpt_list_clone(const MPT_STRUCT(node) *src)
{
	MPT_STRUCT(node) *first = 0, *last = 0;
	
	for (; src; src = src->next) {
		MPT_STRUCT(node) *cpy;
		
		if ((cpy = mpt_node_clone(src))) {
			if (!last) {
				last = first = cpy;
			} else {
				last = mpt_gnode_after(last, cpy);
			}
			/* require empty or cloned subtree */
			if (!src->children
			    || !(cpy->children = mpt_list_clone(src->children))) {
				continue;
			}
		}
		for (cpy = first; cpy; cpy = first) {
			first = first->next;
			mpt_node_unlink(cpy);
			mpt_node_destroy(cpy);
		}
		return 0;
	}
	return first;
}